

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O2

FUNCTION_RETURN generate_ethernet_pc_id(PcIdentifier *identifiers,uint *num_identifiers,int use_mac)

{
  FUNCTION_RETURN FVar1;
  OsAdapterInfo *adapterInfos;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uchar uVar5;
  uchar *puVar6;
  ulong uVar7;
  size_t adapters;
  size_t local_38;
  
  local_38 = 0;
  if ((identifiers == (PcIdentifier *)0x0) || (uVar7 = (ulong)*num_identifiers, uVar7 == 0)) {
    FVar1 = getAdapterInfos((OsAdapterInfo *)0x0,&local_38);
    if ((FVar1 == FUNC_RET_BUFFER_TOO_SMALL) || (FVar1 == FUNC_RET_OK)) {
      *num_identifiers = (uint)local_38;
      FVar1 = FUNC_RET_OK;
    }
  }
  else {
    local_38 = uVar7;
    adapterInfos = (OsAdapterInfo *)malloc(uVar7 * 0x414);
    FVar1 = getAdapterInfos(adapterInfos,&local_38);
    if ((FVar1 == FUNC_RET_BUFFER_TOO_SMALL) || (FVar1 == FUNC_RET_OK)) {
      for (uVar2 = 0; uVar3 = (ulong)uVar2, uVar3 < local_38; uVar2 = uVar2 + 1) {
        for (uVar4 = 0; uVar4 != 6; uVar4 = uVar4 + 1) {
          if (use_mac == 0) {
            uVar5 = '*';
            if (uVar4 < 4) {
              puVar6 = adapterInfos[uVar3].ipv4_address + uVar4;
              goto LAB_001edad4;
            }
          }
          else {
            puVar6 = adapterInfos[uVar3].mac_address + uVar4 + 2;
LAB_001edad4:
            uVar5 = *puVar6;
          }
          identifiers[uVar3][uVar4] = uVar5;
        }
      }
      FVar1 = (uint)(uVar7 < local_38) * 3;
    }
    free(adapterInfos);
  }
  return FVar1;
}

Assistant:

static FUNCTION_RETURN generate_ethernet_pc_id(PcIdentifier * identifiers,
		unsigned int * num_identifiers, int use_mac) {
	FUNCTION_RETURN result_adapterInfos;
	unsigned int j, k;
	OsAdapterInfo *adapterInfos;
	size_t defined_adapters, adapters = 0;

	if (identifiers == NULL || *num_identifiers == 0) {
		result_adapterInfos = getAdapterInfos(NULL, &adapters);
		if (result_adapterInfos == FUNC_RET_OK
				|| result_adapterInfos == FUNC_RET_BUFFER_TOO_SMALL) {
			*num_identifiers = adapters;
			result_adapterInfos = FUNC_RET_OK;
		}
	} else {
		defined_adapters = adapters = *num_identifiers;
		adapterInfos = (OsAdapterInfo*) malloc(
				adapters * sizeof(OsAdapterInfo));
		result_adapterInfos = getAdapterInfos(adapterInfos, &adapters);
		if (result_adapterInfos == FUNC_RET_BUFFER_TOO_SMALL
				|| result_adapterInfos == FUNC_RET_OK) {
			for (j = 0; j < adapters; j++) {
				for (k = 0; k < 6; k++)
					if (use_mac) {
						identifiers[j][k] = adapterInfos[j].mac_address[k + 2];
					} else {
						//use ip
						if (k < 4) {
							identifiers[j][k] = adapterInfos[j].ipv4_address[k];
						} else {
							//padding
							identifiers[j][k] = 42;
						}
					}
			}
			result_adapterInfos = (
					adapters > defined_adapters ?
							FUNC_RET_BUFFER_TOO_SMALL : FUNC_RET_OK);
		}
		free(adapterInfos);
	}
	return result_adapterInfos;
}